

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandRead(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Io_FileType_t IVar4;
  size_t sVar5;
  char *pcVar6;
  Abc_Ntk_t *pAVar7;
  Gia_Man_t *pNew;
  void *pvVar8;
  char *pcVar9;
  char *pcVar10;
  uint fCheck;
  uint local_420;
  char Command [1000];
  
  glo_fMapped = 0;
  local_420 = 0;
  Extra_UtilGetoptReset();
  fCheck = 1;
  bVar2 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"mcbgh"), iVar3 == 0x6d) {
      glo_fMapped = glo_fMapped ^ 1;
    }
    if (iVar3 == -1) break;
    if (iVar3 == 0x62) {
      local_420 = local_420 ^ 1;
    }
    else if (iVar3 == 99) {
      fCheck = fCheck ^ 1;
    }
    else {
      if (iVar3 != 0x67) goto LAB_002d0c11;
      bVar2 = (bool)(bVar2 ^ 1);
    }
  }
  if (globalUtilOptind + 1 == argc) {
    pcVar9 = argv[globalUtilOptind];
    pcVar10 = pcVar9;
    goto LAB_002d0bf3;
  }
LAB_002d0c11:
  fwrite("usage: read [-mcbgh] <file>\n",0x1c,1,(FILE *)pAbc->Err);
  fwrite("\t         replaces the current network by the network read from <file>\n",0x47,1,
         (FILE *)pAbc->Err);
  fwrite("\t         by calling the parser that matches the extension of <file>\n",0x45,1,
         (FILE *)pAbc->Err);
  fwrite("\t         (to read a hierarchical design, use \"read_hie\")\n",0x3a,1,(FILE *)pAbc->Err);
  pcVar10 = "yes";
  pcVar9 = "yes";
  if (glo_fMapped == 0) {
    pcVar9 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-m     : toggle reading mapped Verilog [default = %s]\n",pcVar9);
  pcVar9 = "yes";
  if (fCheck == 0) {
    pcVar9 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",pcVar9)
  ;
  if (local_420 == 0) {
    pcVar10 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-b     : toggle reading barrier buffers [default = %s]\n",pcVar10);
  fprintf((FILE *)pAbc->Err,"\t-g     : toggle reading and flattening into &-space [default = %s]\n"
          ,pcVar10);
  fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
  fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  return 1;
LAB_002d0bf3:
  cVar1 = *pcVar10;
  if ((cVar1 == '>') || (cVar1 == '\\')) {
    *pcVar10 = '/';
  }
  else if (cVar1 == '\0') goto LAB_002d0d4e;
  pcVar10 = pcVar10 + 1;
  goto LAB_002d0bf3;
LAB_002d0d4e:
  Command[0] = '\0';
  sVar5 = strlen(pcVar9);
  if (899 < sVar5) {
    __assert_fail("strlen(pFileName) < 900",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/io.c"
                  ,0xdd,"int IoCommandRead(Abc_Frame_t *, int, char **)");
  }
  pcVar10 = Extra_FileNameExtension(pcVar9);
  iVar3 = strcmp(pcVar10,"genlib");
  if (iVar3 == 0) {
    pcVar10 = "read_genlib %s";
  }
  else {
    pcVar10 = Extra_FileNameExtension(pcVar9);
    iVar3 = strcmp(pcVar10,"lib");
    if (iVar3 == 0) {
      pcVar10 = "read_lib %s";
    }
    else {
      pcVar10 = Extra_FileNameExtension(pcVar9);
      iVar3 = strcmp(pcVar10,"scl");
      if (iVar3 == 0) {
        pcVar10 = "read_scl %s";
      }
      else {
        pcVar10 = Extra_FileNameExtension(pcVar9);
        iVar3 = strcmp(pcVar10,"super");
        if (iVar3 == 0) {
          pcVar10 = "read_super %s";
        }
        else {
          pcVar10 = Extra_FileNameExtension(pcVar9);
          iVar3 = strcmp(pcVar10,"constr");
          if (iVar3 == 0) {
            pcVar10 = "read_constr %s";
          }
          else {
            pcVar6 = Extra_FileNameExtension(pcVar9);
            pcVar10 = "so %s";
            if ((*pcVar6 != 'c') || (pcVar6[1] != '\0')) {
              pcVar6 = Extra_FileNameExtension(pcVar9);
              iVar3 = strcmp(pcVar6,"script");
              if (iVar3 != 0) {
                pcVar10 = Extra_FileNameExtension(pcVar9);
                iVar3 = strcmp(pcVar10,"dsd");
                if (iVar3 != 0) goto LAB_002d0e94;
                pcVar10 = "dsd_load %s";
              }
            }
          }
        }
      }
    }
  }
  sprintf(Command,pcVar10,pcVar9);
LAB_002d0e94:
  if (Command[0] != '\0') {
    Cmd_CommandExecute(pAbc,Command);
    return 0;
  }
  if (bVar2) {
    IVar4 = Io_ReadFileType(pcVar9);
    pAVar7 = Io_ReadNetlist(pcVar9,IVar4,fCheck);
    if (pAVar7 == (Abc_Ntk_t *)0x0) {
      return 0;
    }
    pNew = Abc_NtkFlattenHierarchyGia(pAVar7,(Vec_Ptr_t **)0x0,0);
    Abc_NtkDelete(pAVar7);
    if (pNew != (Gia_Man_t *)0x0) {
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    pcVar9 = "Abc_CommandBlast(): Bit-blasting has failed.\n";
  }
  else {
    if ((glo_fMapped == 0) || (pvVar8 = Abc_FrameReadLibGen(), pvVar8 != (void *)0x0)) {
      IVar4 = Io_ReadFileType(pcVar9);
      pAVar7 = Io_Read(pcVar9,IVar4,fCheck,local_420);
      if (pAVar7 != (Abc_Ntk_t *)0x0) {
        if (pAVar7->vPis->nSize == 0) {
          Abc_Print(0,"The new network has no primary inputs. It is recommended\n");
          Abc_Print(1,"to add a dummy PI to make sure all commands work correctly.\n");
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar7);
        Abc_FrameCopyLTLDataBase(pAbc,pAVar7);
        Abc_FrameClearVerifStatus(pAbc);
        return 0;
      }
      return 0;
    }
    pcVar9 = "Cannot read mapped design when the library is not given.\n";
  }
  Abc_Print(1,pcVar9);
  return 0;
}

Assistant:

int IoCommandRead( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Command[1000];
    Abc_Ntk_t * pNtk;
    char * pFileName, * pTemp;
    int c, fCheck, fBarBufs, fReadGia;

    fCheck = 1;
    fBarBufs = 0;
    fReadGia = 0;
    glo_fMapped = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mcbgh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'm':
                glo_fMapped ^= 1;
                break;
            case 'c':
                fCheck ^= 1;
                break;
            case 'b':
                fBarBufs ^= 1;
                break;
            case 'g':
                fReadGia ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // fix the wrong symbol
    for ( pTemp = pFileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' || *pTemp == '\\' )
            *pTemp = '/';
    // read libraries
    Command[0] = 0;
    assert( strlen(pFileName) < 900 );
    if ( !strcmp( Extra_FileNameExtension(pFileName), "genlib" )  )
        sprintf( Command, "read_genlib %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "lib" ) )
        sprintf( Command, "read_lib %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "scl" ) )
        sprintf( Command, "read_scl %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "super" ) )
        sprintf( Command, "read_super %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "constr" ) )
        sprintf( Command, "read_constr %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "c" ) )
        sprintf( Command, "so %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "script" ) )
        sprintf( Command, "so %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "dsd" ) )
        sprintf( Command, "dsd_load %s", pFileName );
    if ( Command[0] )
    {
        Cmd_CommandExecute( pAbc, Command );
        return 0;
    }
    if ( fReadGia )
    {
        Abc_Ntk_t * pNtk = Io_ReadNetlist( pFileName, Io_ReadFileType(pFileName), fCheck );
        if ( pNtk )
        {
            Gia_Man_t * pGia = Abc_NtkFlattenHierarchyGia( pNtk, NULL, 0 );
            Abc_NtkDelete( pNtk );
            if ( pGia == NULL )
            {
                Abc_Print( 1, "Abc_CommandBlast(): Bit-blasting has failed.\n" );
                return 0;
            }
            Abc_FrameUpdateGia( pAbc, pGia );
        }
        return 0;
    }
    // check if the library is available
    if ( glo_fMapped && Abc_FrameReadLibGen() == NULL )
    {
        Abc_Print( 1, "Cannot read mapped design when the library is not given.\n" );
        return 0;
    }
    // read the file using the corresponding file reader
    pNtk = Io_Read( pFileName, Io_ReadFileType(pFileName), fCheck, fBarBufs );
    if ( pNtk == NULL )
        return 0;
    if ( Abc_NtkPiNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The new network has no primary inputs. It is recommended\n" );
        Abc_Print( 1, "to add a dummy PI to make sure all commands work correctly.\n" );
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameCopyLTLDataBase( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read [-mcbgh] <file>\n" );
    fprintf( pAbc->Err, "\t         replaces the current network by the network read from <file>\n" );
    fprintf( pAbc->Err, "\t         by calling the parser that matches the extension of <file>\n" );
    fprintf( pAbc->Err, "\t         (to read a hierarchical design, use \"read_hie\")\n" );
    fprintf( pAbc->Err, "\t-m     : toggle reading mapped Verilog [default = %s]\n", glo_fMapped? "yes":"no" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-b     : toggle reading barrier buffers [default = %s]\n", fBarBufs? "yes":"no" );
    fprintf( pAbc->Err, "\t-g     : toggle reading and flattening into &-space [default = %s]\n", fBarBufs? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}